

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall V2Transport::V2Transport(V2Transport *this,NodeId nodeid,bool initiating)

{
  uint uVar1;
  long in_FS_OFFSET;
  Span<const_std::byte> ent32;
  Span<std::byte> output;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  CKey local_e8;
  byte local_d8 [32];
  FastRandomContext local_b8;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey(SUB81(&local_e8,0));
  GetRandHash();
  local_108._M_impl.super__Vector_impl_data._M_start = (byte *)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FastRandomContext::FastRandomContext(&local_b8,false);
  uVar1 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                    (&local_b8.super_RandomMixin<FastRandomContext>,0x1000);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108,(ulong)uVar1);
  output.m_size =
       (long)local_108._M_impl.super__Vector_impl_data._M_finish -
       (long)local_108._M_impl.super__Vector_impl_data._M_start;
  output.m_data = local_108._M_impl.super__Vector_impl_data._M_start;
  FastRandomContext::fillrand(&local_b8,output);
  ChaCha20::~ChaCha20(&local_b8.rng);
  ent32.m_size = 0x20;
  ent32.m_data = local_d8;
  V2Transport(this,nodeid,initiating,&local_e8,ent32,
              (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_108);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
  std::
  unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
  ::~unique_ptr(&local_e8.keydata);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

V2Transport::V2Transport(NodeId nodeid, bool initiating) noexcept
    : V2Transport{nodeid, initiating, GenerateRandomKey(),
                  MakeByteSpan(GetRandHash()), GenerateRandomGarbage()} {}